

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieBuilder::getLimitOfLinearMatch
          (UCharsTrieBuilder *this,int32_t first,int32_t last,int32_t unitIndex)

{
  UCharsTrieElement *this_00;
  UCharsTrieElement *pUVar1;
  int iVar2;
  UChar UVar3;
  UChar UVar4;
  int32_t iVar5;
  UnicodeString *strings;
  int32_t index;
  
  pUVar1 = this->elements;
  this_00 = pUVar1 + first;
  strings = &this->strings;
  iVar5 = UCharsTrieElement::getStringLength(this_00,strings);
  iVar2 = unitIndex + 1;
  do {
    index = iVar2;
    if (iVar5 <= index) {
      return index;
    }
    UVar3 = UCharsTrieElement::charAt(this_00,index,strings);
    UVar4 = UCharsTrieElement::charAt(pUVar1 + last,index,strings);
    iVar2 = index + 1;
  } while (UVar3 == UVar4);
  return index;
}

Assistant:

int32_t
UCharsTrieBuilder::getLimitOfLinearMatch(int32_t first, int32_t last, int32_t unitIndex) const {
    const UCharsTrieElement &firstElement=elements[first];
    const UCharsTrieElement &lastElement=elements[last];
    int32_t minStringLength=firstElement.getStringLength(strings);
    while(++unitIndex<minStringLength &&
            firstElement.charAt(unitIndex, strings)==
            lastElement.charAt(unitIndex, strings)) {}
    return unitIndex;
}